

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O3

bool picojson::
     _parse_string<std::__cxx11::string,std::istreambuf_iterator<char,std::char_traits<char>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *in)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  FILE *extraout_RDX;
  FILE *extraout_RDX_00;
  FILE *__stream_00;
  
  __stream_00 = (FILE *)in;
  iVar2 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::getc(in,(FILE *)in);
  __stream = extraout_RDX;
  while (0x1f < iVar2) {
    if (iVar2 != 0x5c) {
      if (iVar2 == 0x22) {
        return true;
      }
      goto LAB_001177be;
    }
    iVar2 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::getc(in,__stream_00);
    if (iVar2 < 0x62) {
      if (iVar2 == 0x22) {
        iVar2 = 0x22;
      }
      else if (iVar2 == 0x2f) {
        iVar2 = 0x2f;
      }
      else {
        if (iVar2 != 0x5c) {
          return false;
        }
        iVar2 = 0x5c;
      }
      goto LAB_001177be;
    }
    switch(iVar2) {
    case 0x6e:
      iVar2 = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
      goto switchD_0011780b_caseD_6f;
    case 0x72:
      iVar2 = 0xd;
      break;
    case 0x74:
      iVar2 = 9;
      break;
    case 0x75:
      __stream_00 = (FILE *)in;
      bVar1 = _parse_codepoint<std::__cxx11::string,std::istreambuf_iterator<char,std::char_traits<char>>>
                        (out,in);
      if (!bVar1) {
        return false;
      }
      goto LAB_001177c9;
    default:
      if (iVar2 == 0x62) {
        iVar2 = 8;
      }
      else {
        if (iVar2 != 0x66) {
          return false;
        }
        iVar2 = 0xc;
      }
    }
LAB_001177be:
    __stream_00 = (FILE *)(ulong)(uint)(int)(char)iVar2;
    std::__cxx11::string::push_back((char)out);
LAB_001177c9:
    iVar2 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::getc(in,__stream_00);
    __stream = extraout_RDX_00;
  }
  input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::ungetc
            (in,(int)__stream_00,__stream);
switchD_0011780b_caseD_6f:
  return false;
}

Assistant:

inline bool _parse_string(String& out, input<Iter>& in) {
    while (1) {
      int ch = in.getc();
      if (ch < ' ') {
    in.ungetc();
    return false;
      } else if (ch == '"') {
    return true;
      } else if (ch == '\\') {
    if ((ch = in.getc()) == -1) {
      return false;
    }
    switch (ch) {
#define MAP(sym, val) case sym: out.push_back(val); break
      MAP('"', '\"');
      MAP('\\', '\\');
      MAP('/', '/');
      MAP('b', '\b');
      MAP('f', '\f');
      MAP('n', '\n');
      MAP('r', '\r');
      MAP('t', '\t');
#undef MAP
    case 'u':
      if (! _parse_codepoint(out, in)) {
        return false;
      }
      break;
    default:
      return false;
    }
      } else {
    out.push_back(ch);
      }
    }
    return false;
  }